

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

int CoreVfwprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char16_t *format,__va_list_tag *aparg)

{
  undefined4 uVar1;
  long lVar2;
  LPCSTR lpMultiByteStr;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  errno_t eVar6;
  INT IVar7;
  int iVar8;
  size_t sVar9;
  LPWSTR pWVar10;
  int *piVar11;
  long in_FS_OFFSET;
  undefined4 *local_a90;
  undefined4 *local_a78;
  undefined8 *local_a60;
  undefined8 *local_a40;
  INT *local_a20;
  INT *local_a08;
  undefined4 *local_9f0;
  undefined8 *local_9a8;
  undefined8 *local_990;
  INT *local_960;
  INT *local_930;
  undefined1 auStack_918 [8];
  va_list apcopy;
  short s_1;
  int n;
  short trunc2;
  long trunc1;
  LPWSTR TempWideBuffer;
  char *TempSprintfStr;
  char *TempSprintfStrPtr;
  size_t TEMP_COUNT;
  INT Length;
  UINT Length_1;
  LPSTR s;
  undefined1 auStack_8a8 [4];
  BOOL textMode;
  va_list ap;
  int ret;
  int paddingReturnValue;
  int written;
  int mbtowcResult;
  BOOL WStrWasMalloced;
  INT TempInt;
  INT Type;
  INT Prefix;
  INT Precision;
  INT Width;
  INT Flags;
  WCHAR TempWChar [2];
  LPWSTR WorkingWStr;
  LPWSTR TempWStr;
  LPCWSTR Fmt;
  __va_list_tag *aparg_local;
  char16_t *format_local;
  PAL_FILE *stream_local;
  CPalThread *pthrCurrent_local;
  WCHAR local_818 [4];
  char TempSprintfStrBuffer [1024];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Flags = (char16_t *)0x0;
  ret = 0;
  TempWStr = format;
  Fmt = (LPCWSTR)aparg;
  aparg_local = (__va_list_tag *)format;
  format_local = (char16_t *)stream;
  stream_local = (PAL_FILE *)pthrCurrent;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_8a8 = (undefined1  [4])aparg->gp_offset;
  textMode = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
LAB_00132543:
  do {
    if (*TempWStr == L'\0') {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pthrCurrent_local._4_4_ = ret;
LAB_00133805:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return pthrCurrent_local._4_4_;
    }
    if ((*TempWStr == L'%') &&
       (BVar4 = Internal_ExtractFormatW
                          ((CPalThread *)stream_local,&TempWStr,TempSprintfStrBuffer + 0x3f8,
                           &Precision,&Prefix,&Type,&TempInt,&WStrWasMalloced), BVar4 == 1)) {
      if ((((TempInt == 2) || (TempInt == 4)) && ((WStrWasMalloced == 2 || (WStrWasMalloced == 3))))
         || ((WStrWasMalloced == 3 && ((Precision & 4U) != 0)))) {
        bVar3 = false;
        if (Prefix == -2) {
          if ((uint)auStack_8a8 < 0x29) {
            local_930 = (INT *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_930 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_930;
        }
        else if (Prefix == -3) {
          if ((uint)auStack_8a8 < 0x29) {
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if (Type == -2) {
          if ((uint)auStack_8a8 < 0x29) {
            local_960 = (INT *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_960 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_960;
        }
        else if (Type == -4) {
          if ((uint)auStack_8a8 < 0x29) {
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((WStrWasMalloced == 2) || (TempInt == 4)) {
          if ((uint)auStack_8a8 < 0x29) {
            local_990 = (undefined8 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_990 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          WorkingWStr = (LPWSTR)*local_990;
        }
        else {
          if ((uint)auStack_8a8 < 0x29) {
            local_9a8 = (undefined8 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_9a8 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*local_9a8;
          uVar5 = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (uVar5 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVfwprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x4d8);
            fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00133805;
          }
          WorkingWStr = (LPWSTR)CorUnix::InternalMalloc((ulong)uVar5 << 1);
          if (WorkingWStr == (LPWSTR)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00133805;
          }
          bVar3 = true;
          MultiByteToWideChar(0,0,lpMultiByteStr,-1,WorkingWStr,uVar5);
        }
        sVar9 = PAL_wcslen(WorkingWStr);
        TEMP_COUNT._0_4_ = (int)sVar9;
        _Flags = (char16_t *)CorUnix::InternalMalloc((long)((int)TEMP_COUNT + 1) << 1);
        if (_Flags == (char16_t *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(8);
          if (bVar3) {
            CorUnix::InternalFree(WorkingWStr);
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        if (Type == -3) {
          *_Flags = L'\0';
          TEMP_COUNT._0_4_ = 0;
        }
        else if ((Type < 1) || ((int)TEMP_COUNT <= Type)) {
          PAL_wcscpy(_Flags,WorkingWStr);
        }
        else {
          eVar6 = wcsncpy_s((char16_t_conflict *)_Flags,(long)((int)TEMP_COUNT + 1),
                            (char16_t_conflict *)WorkingWStr,(long)(Type + 1));
          if (eVar6 != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            if (bVar3) {
              CorUnix::InternalFree(WorkingWStr);
            }
            CorUnix::InternalFree(_Flags);
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pthrCurrent_local._4_4_ = -1;
            goto LAB_00133805;
          }
          TEMP_COUNT._0_4_ = Type;
        }
        IVar7 = Internal_AddPaddingVfwprintf
                          ((CPalThread *)stream_local,(PAL_FILE *)format_local,_Flags,
                           Prefix - (int)TEMP_COUNT,Precision,1);
        if (IVar7 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if (bVar3) {
            CorUnix::InternalFree(WorkingWStr);
          }
          CorUnix::InternalFree(_Flags);
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        ret = IVar7 + ret;
        CorUnix::InternalFree(_Flags);
        if (bVar3) {
          CorUnix::InternalFree(WorkingWStr);
        }
      }
      else if ((TempInt == 2) && (WStrWasMalloced == 1)) {
        if ((Prefix == -2) || (Prefix == -3)) {
          if ((uint)auStack_8a8 < 0x29) {
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type == -2) || (Type == -4)) {
          if ((uint)auStack_8a8 < 0x29) {
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((uint)auStack_8a8 < 0x29) {
          local_9f0 = (undefined4 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
          auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
        }
        else {
          local_9f0 = (undefined4 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Width._0_2_ = (undefined2)*local_9f0;
        Width._2_2_ = 0;
        IVar7 = Internal_AddPaddingVfwprintf
                          ((CPalThread *)stream_local,(PAL_FILE *)format_local,(LPWSTR)&Width,
                           Prefix + -1,Precision,1);
        if (IVar7 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        ret = IVar7 + ret;
      }
      else if (WStrWasMalloced == 6) {
        if (Prefix == -2) {
          if ((uint)auStack_8a8 < 0x29) {
            local_a08 = (INT *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a08 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Prefix = *local_a08;
        }
        if (Type == -2) {
          if ((uint)auStack_8a8 < 0x29) {
            local_a20 = (INT *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a20 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Type = *local_a20;
        }
        if (TempInt == 1) {
          if ((uint)auStack_8a8 < 0x29) {
            local_a40 = (undefined8 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a40 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*local_a40 = (short)ret;
        }
        else {
          if ((uint)auStack_8a8 < 0x29) {
            local_a60 = (undefined8 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a60 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*local_a60 = ret;
        }
      }
      else {
        TempSprintfStr = (char *)0x0;
        TempWideBuffer = local_818;
        if ((WStrWasMalloced == 5) && (TempInt == 1)) {
          if ((uint)auStack_8a8 < 0x29) {
            local_a78 = (undefined4 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a78 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar1 = *local_a78;
          uVar5 = snprintf((char *)TempWideBuffer,0x400,TempSprintfStrBuffer + 0x3f8,
                           (long)(short)uVar1);
          if (((int)uVar5 < 0) || (0x3ff < uVar5)) {
            TempWideBuffer = (LPWSTR)CorUnix::InternalMalloc((long)(int)(uVar5 + 1));
            if (TempWideBuffer == (LPWSTR)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(8);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_00133805;
            }
            snprintf((char *)TempWideBuffer,(long)(int)(uVar5 + 1),TempSprintfStrBuffer + 0x3f8,
                     (ulong)(uint)(int)(short)uVar1);
            TempSprintfStr = (char *)TempWideBuffer;
          }
        }
        else if ((WStrWasMalloced == 4) && (TempInt == 1)) {
          if ((uint)auStack_8a8 < 0x29) {
            local_a90 = (undefined4 *)((long)(int)auStack_8a8 + (long)ap[0].overflow_arg_area);
            auStack_8a8 = (undefined1  [4])((int)auStack_8a8 + 8);
          }
          else {
            local_a90 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar1 = *local_a90;
          uVar5 = snprintf((char *)TempWideBuffer,0x400,TempSprintfStrBuffer + 0x3f8,
                           (ulong)(uint)(int)(short)uVar1);
          if (((int)uVar5 < 0) || (0x3ff < uVar5)) {
            TempWideBuffer = (LPWSTR)CorUnix::InternalMalloc((long)(int)(uVar5 + 1));
            if (TempWideBuffer == (LPWSTR)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(8);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_00133805;
            }
            snprintf((char *)TempWideBuffer,(long)(int)(uVar5 + 1),TempSprintfStrBuffer + 0x3f8,
                     (ulong)(uint)(int)(short)uVar1);
            TempSprintfStr = (char *)TempWideBuffer;
          }
        }
        else {
          apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
          auStack_918._0_4_ = auStack_8a8;
          auStack_918._4_4_ = textMode;
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          uVar5 = vsnprintf((char *)TempWideBuffer,0x400,TempSprintfStrBuffer + 0x3f8,auStack_918);
          PAL_printf_arg_remover((va_list *)auStack_8a8,Prefix,Type,WStrWasMalloced,TempInt);
          if (((int)uVar5 < 0) || (0x3ff < uVar5)) {
            TempWideBuffer = (LPWSTR)CorUnix::InternalMalloc((long)(int)(uVar5 + 1));
            if (TempWideBuffer == (LPWSTR)0x0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(8);
              pthrCurrent_local._4_4_ = -1;
              goto LAB_00133805;
            }
            apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
            auStack_918._0_4_ = auStack_8a8;
            auStack_918._4_4_ = textMode;
            apcopy[0].gp_offset = ap[0].gp_offset;
            apcopy[0].fp_offset = ap[0].fp_offset;
            vsnprintf((char *)TempWideBuffer,(long)(int)(uVar5 + 1),TempSprintfStrBuffer + 0x3f8,
                      auStack_918);
            PAL_printf_arg_remover((va_list *)auStack_8a8,Prefix,Type,WStrWasMalloced,TempInt);
            TempSprintfStr = (char *)TempWideBuffer;
          }
        }
        iVar8 = MultiByteToWideChar(0,0,(LPCSTR)TempWideBuffer,-1,(LPWSTR)0x0,0);
        if (iVar8 == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if (TempSprintfStr != (char *)0x0) {
            CorUnix::InternalFree(TempSprintfStr);
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        pWVar10 = (LPWSTR)CorUnix::InternalMalloc((long)iVar8 << 1);
        if (pWVar10 == (LPWSTR)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(8);
          if (TempSprintfStr != (char *)0x0) {
            CorUnix::InternalFree(TempSprintfStr);
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        MultiByteToWideChar(0,0,(LPCSTR)TempWideBuffer,-1,pWVar10,iVar8);
        iVar8 = Internal_Convertfwrite
                          ((CPalThread *)stream_local,pWVar10,2,(long)(iVar8 + -1),
                           *(FILE **)format_local,1);
        if (iVar8 == -1) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar11 = __errno_location();
          strerror(*piVar11);
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::InternalFree(pWVar10);
          if (TempSprintfStr != (char *)0x0) {
            CorUnix::InternalFree(TempSprintfStr);
          }
          pthrCurrent_local._4_4_ = -1;
          goto LAB_00133805;
        }
        if (TempSprintfStr != (char *)0x0) {
          CorUnix::InternalFree(TempSprintfStr);
        }
        CorUnix::InternalFree(pWVar10);
      }
      goto LAB_00132543;
    }
    pWVar10 = TempWStr;
    TempWStr = TempWStr + 1;
    iVar8 = Internal_Convertfwrite((CPalThread *)stream_local,pWVar10,2,1,*(FILE **)format_local,1);
    if (iVar8 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pthrCurrent_local._4_4_ = -1;
      goto LAB_00133805;
    }
    ret = ret + 1;
  } while( true );
}

Assistant:

int CoreVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char16_t *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCWSTR Fmt = format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    BOOL WStrWasMalloced = FALSE;
    int mbtowcResult;
    int written=0;
    int paddingReturnValue;
    int ret;
    va_list ap;

    /* fwprintf for now in the PAL is always used on file opened
       in text mode. In those case the output should be ANSI not Unicode */
    BOOL textMode = TRUE;

    PERF_ENTRY(vfwprintf);
    ENTRY("vfwprintf (stream=%p, format=%p (%S))\n",
          stream, format, format);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                 (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                 (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                WStrWasMalloced = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (Type == PFF_TYPE_STRING || Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    /* %lS assumes a LPSTR argument. */
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc( (Length) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            WStrWasMalloced = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        LOGEXIT("vfwprintf returns int -1\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = PAL_wcslen(TempWStr);
                WorkingWStr = (LPWSTR) InternalMalloc((sizeof(WCHAR) * (Length + 1)));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision+1) != SAFECRT_SUCCESS)
                    {
                        ERROR("Internal_AddPaddingVfwprintf failed\n");
                        if (WStrWasMalloced)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return (-1);
                    }

                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }


                /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf( pthrCurrent, stream, WorkingWStr,
                                                 Width - Length,
                                                 Flags,textMode);

                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    InternalFree(WorkingWStr);
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return (-1);
                }
                written += paddingReturnValue;

                InternalFree(WorkingWStr);
                if (WStrWasMalloced)
                {
                    InternalFree(TempWStr);
                }
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

               /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf(pthrCurrent, stream, TempWChar,
                                                 Width - 1,
                                                 Flags,textMode);
                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return(-1);
                }
                written += paddingReturnValue;
            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else
            {
                // Types that sprintf can handle.

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */

                // This argument will be limited to 1024 characters.
                // It should be enough.
                size_t TEMP_COUNT = 1024;
                char TempSprintfStrBuffer[1024];
                char *TempSprintfStrPtr = NULL;
                char *TempSprintfStr = TempSprintfStrBuffer;
                LPWSTR TempWideBuffer;

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, trunc1);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, trunc2);
                    }
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, s);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, s);
                    }
                }
                else
                {
                    va_list apcopy;

                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(TempSprintfStr, TEMP_COUNT, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        va_copy(apcopy, ap);
                        vsnprintf(TempSprintfStr, TempInt, TempBuff, apcopy);
                        va_end(apcopy);
                        PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                    }
                }

                mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                   TempSprintfStr, -1,
                                                   NULL, 0);

                if (mbtowcResult == 0)
                {
                    ERROR("MultiByteToWideChar failed\n");
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return -1;
                }

                TempWideBuffer = (LPWSTR) InternalMalloc(mbtowcResult*sizeof(WCHAR));
                if (!TempWideBuffer)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }

                MultiByteToWideChar(CP_ACP, 0, TempSprintfStr, -1,
                                    TempWideBuffer, mbtowcResult);

                ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    TempWideBuffer,
                                    sizeof(char16_t),
                                    mbtowcResult-1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode);

                if (-1 == ret)
                {
                    ERROR("fwrite() failed with errno == %d (%s)\n", errno, strerror(errno));
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    InternalFree(TempWideBuffer);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }
                if(TempSprintfStrPtr)
                {
                    InternalFree(TempSprintfStrPtr);
                }
                InternalFree(TempWideBuffer);
            }
        }
        else
        {
            ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    Fmt++,
                                    sizeof(char16_t),
                                    1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode); /* copy regular chars into buffer */

            if (-1 == ret)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                LOGEXIT("vfwprintf returns int -1\n");
                PERF_EXIT(vfwprintf);
                va_end(ap);
                return -1;
            }
            ++written;
       }
    }

    LOGEXIT("vfwprintf returns int %d\n", written);
    PERF_EXIT(vfwprintf);
    va_end(ap);
    return (written);
}